

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O1

void embree::sse2::SphereMiMBIntersectorK<4,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float fVar9;
  Geometry *pGVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  int iVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  ulong uVar23;
  RTCFilterFunctionN p_Var24;
  RayHitK<4> *pRVar25;
  long lVar26;
  ulong uVar27;
  Scene *pSVar28;
  long lVar29;
  ulong uVar30;
  RayQueryContext *pRVar31;
  ulong uVar32;
  long lVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar54;
  float fVar56;
  float fVar58;
  undefined1 auVar42 [16];
  uint uVar41;
  uint uVar55;
  uint uVar57;
  uint uVar59;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar60;
  uint uVar61;
  float fVar74;
  float fVar76;
  float fVar78;
  undefined1 auVar62 [16];
  uint uVar75;
  uint uVar77;
  uint uVar79;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  uint uVar94;
  uint uVar95;
  uint uVar96;
  uint uVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  uint uVar119;
  uint uVar120;
  uint uVar121;
  uint uVar122;
  vbool<4> valid;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<4> hit;
  HitK<4> h;
  undefined1 local_238 [16];
  Scene *local_228;
  RayQueryContext *local_220;
  undefined8 local_218;
  uint uStack_210;
  uint uStack_20c;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined4 local_1dc;
  RTCFilterFunctionNArguments local_1d8;
  float local_1a8 [4];
  float local_198 [4];
  float local_188 [4];
  float local_178 [4];
  undefined1 local_168 [16];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  uint local_148;
  uint uStack_144;
  uint uStack_140;
  uint uStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  uint local_d8 [4];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  local_228 = context->scene;
  uVar96 = sphere->sharedGeomID;
  uVar23 = (ulong)(sphere->primIDs).field_0.i[0];
  pGVar10 = (local_228->geometries).items[uVar96].ptr;
  local_218 = (Scene *)CONCAT44(local_218._4_4_,pGVar10->fnumTimeSegments);
  fVar38 = (pGVar10->time_range).lower;
  fVar38 = ((*(float *)(ray + k * 4 + 0x70) - fVar38) / ((pGVar10->time_range).upper - fVar38)) *
           pGVar10->fnumTimeSegments;
  _local_1f8 = ZEXT416((uint)fVar38);
  local_220 = context;
  fVar38 = floorf(fVar38);
  if ((float)local_218 + -1.0 <= fVar38) {
    fVar38 = (float)local_218 + -1.0;
  }
  fVar107 = 0.0;
  if (0.0 <= fVar38) {
    fVar107 = fVar38;
  }
  fVar100 = (float)local_1f8._0_4_ - fVar107;
  lVar29 = *(long *)&pGVar10[2].numPrimitives;
  lVar26 = (long)(int)fVar107 * 0x38;
  lVar33 = *(long *)(lVar29 + lVar26);
  lVar11 = *(long *)(lVar29 + 0x10 + lVar26);
  pfVar1 = (float *)(lVar33 + lVar11 * uVar23);
  uVar27 = (ulong)(sphere->primIDs).field_0.i[1];
  pfVar2 = (float *)(lVar33 + lVar11 * uVar27);
  uVar30 = (ulong)(sphere->primIDs).field_0.i[2];
  pfVar3 = (float *)(lVar33 + lVar11 * uVar30);
  uVar32 = (ulong)(sphere->primIDs).field_0.i[3];
  pfVar4 = (float *)(lVar33 + lVar11 * uVar32);
  lVar33 = *(long *)(lVar29 + 0x38 + lVar26);
  lVar29 = *(long *)(lVar29 + 0x48 + lVar26);
  pfVar5 = (float *)(lVar33 + uVar23 * lVar29);
  pfVar6 = (float *)(lVar33 + uVar27 * lVar29);
  pfVar7 = (float *)(lVar33 + uVar30 * lVar29);
  pfVar8 = (float *)(lVar33 + lVar29 * uVar32);
  fVar39 = 1.0 - fVar100;
  fVar40 = fVar39 * pfVar1[3] + fVar100 * pfVar5[3];
  fVar54 = fVar39 * pfVar2[3] + fVar100 * pfVar6[3];
  fVar56 = fVar39 * pfVar3[3] + fVar100 * pfVar7[3];
  fVar58 = fVar39 * pfVar4[3] + fVar100 * pfVar8[3];
  uVar97 = (uint)sphere->numPrimitives;
  local_d8[0] = uVar96;
  local_d8[1] = uVar96;
  local_d8[2] = uVar96;
  local_d8[3] = uVar96;
  fVar38 = *(float *)(ray + k * 4);
  fVar107 = *(float *)(ray + k * 4 + 0x10);
  fVar114 = *(float *)(ray + k * 4 + 0x20);
  fVar108 = (*pfVar1 * fVar39 + *pfVar5 * fVar100) - fVar38;
  fVar109 = (*pfVar2 * fVar39 + *pfVar6 * fVar100) - fVar38;
  fVar110 = (*pfVar3 * fVar39 + *pfVar7 * fVar100) - fVar38;
  fVar38 = (*pfVar4 * fVar39 + *pfVar8 * fVar100) - fVar38;
  fVar104 = (pfVar1[1] * fVar39 + pfVar5[1] * fVar100) - fVar107;
  fVar105 = (pfVar2[1] * fVar39 + pfVar6[1] * fVar100) - fVar107;
  fVar106 = (pfVar3[1] * fVar39 + pfVar7[1] * fVar100) - fVar107;
  fVar107 = (pfVar4[1] * fVar39 + pfVar8[1] * fVar100) - fVar107;
  fVar111 = (pfVar1[2] * fVar39 + pfVar5[2] * fVar100) - fVar114;
  fVar112 = (pfVar2[2] * fVar39 + pfVar6[2] * fVar100) - fVar114;
  fVar113 = (pfVar3[2] * fVar39 + pfVar7[2] * fVar100) - fVar114;
  fVar114 = (pfVar4[2] * fVar39 + pfVar8[2] * fVar100) - fVar114;
  fVar39 = *(float *)(ray + k * 4 + 0x40);
  fVar100 = *(float *)(ray + k * 4 + 0x50);
  fVar118 = *(float *)(ray + k * 4 + 0x60);
  fVar89 = fVar100 * fVar100 + fVar118 * fVar118;
  auVar92._0_4_ = fVar39 * fVar39 + fVar89;
  auVar92._4_4_ = auVar92._0_4_;
  auVar92._8_4_ = auVar92._0_4_;
  auVar92._12_4_ = auVar92._0_4_;
  auVar90 = rcpps(ZEXT416((uint)fVar89),auVar92);
  fVar60 = auVar90._0_4_;
  fVar74 = auVar90._4_4_;
  fVar76 = auVar90._8_4_;
  fVar78 = auVar90._12_4_;
  fVar60 = (1.0 - auVar92._0_4_ * fVar60) * fVar60 + fVar60;
  fVar74 = (1.0 - auVar92._0_4_ * fVar74) * fVar74 + fVar74;
  fVar76 = (1.0 - auVar92._0_4_ * fVar76) * fVar76 + fVar76;
  fVar78 = (1.0 - auVar92._0_4_ * fVar78) * fVar78 + fVar78;
  fVar89 = (fVar108 * fVar39 + fVar104 * fVar100 + fVar111 * fVar118) * fVar60;
  fVar101 = (fVar109 * fVar39 + fVar105 * fVar100 + fVar112 * fVar118) * fVar74;
  fVar102 = (fVar110 * fVar39 + fVar106 * fVar100 + fVar113 * fVar118) * fVar76;
  fVar103 = (fVar38 * fVar39 + fVar107 * fVar100 + fVar114 * fVar118) * fVar78;
  fVar108 = fVar108 - fVar39 * fVar89;
  fVar109 = fVar109 - fVar39 * fVar101;
  fVar110 = fVar110 - fVar39 * fVar102;
  fVar38 = fVar38 - fVar39 * fVar103;
  fVar104 = fVar104 - fVar100 * fVar89;
  fVar105 = fVar105 - fVar100 * fVar101;
  fVar106 = fVar106 - fVar100 * fVar102;
  fVar107 = fVar107 - fVar100 * fVar103;
  fVar111 = fVar111 - fVar118 * fVar89;
  fVar112 = fVar112 - fVar118 * fVar101;
  fVar113 = fVar113 - fVar118 * fVar102;
  fVar114 = fVar114 - fVar118 * fVar103;
  auVar91._0_4_ = fVar108 * fVar108 + fVar104 * fVar104 + fVar111 * fVar111;
  auVar91._4_4_ = fVar109 * fVar109 + fVar105 * fVar105 + fVar112 * fVar112;
  auVar91._8_4_ = fVar110 * fVar110 + fVar106 * fVar106 + fVar113 * fVar113;
  auVar91._12_4_ = fVar38 * fVar38 + fVar107 * fVar107 + fVar114 * fVar114;
  fVar40 = fVar40 * fVar40;
  fVar54 = fVar54 * fVar54;
  fVar56 = fVar56 * fVar56;
  fVar58 = fVar58 * fVar58;
  bVar18 = uVar97 != 0 && auVar91._0_4_ <= fVar40;
  auVar90._0_4_ = -(uint)bVar18;
  bVar19 = 1 < uVar97 && auVar91._4_4_ <= fVar54;
  auVar90._4_4_ = -(uint)bVar19;
  bVar17 = 2 < uVar97 && auVar91._8_4_ <= fVar56;
  auVar90._8_4_ = -(uint)bVar17;
  bVar16 = 3 < uVar97 && auVar91._12_4_ <= fVar58;
  auVar90._12_4_ = -(uint)bVar16;
  iVar20 = movmskps(uVar97,auVar90);
  if (iVar20 != 0) {
    auVar62._0_4_ = fVar60 * (fVar40 - auVar91._0_4_);
    auVar62._4_4_ = fVar74 * (fVar54 - auVar91._4_4_);
    auVar62._8_4_ = fVar76 * (fVar56 - auVar91._8_4_);
    auVar62._12_4_ = fVar78 * (fVar58 - auVar91._12_4_);
    auVar92 = sqrtps(auVar91,auVar62);
    fVar56 = auVar92._0_4_;
    fVar76 = fVar89 - fVar56;
    fVar58 = auVar92._4_4_;
    fVar78 = fVar101 - fVar58;
    fVar60 = auVar92._8_4_;
    fVar98 = fVar102 - fVar60;
    fVar74 = auVar92._12_4_;
    fVar99 = fVar103 - fVar74;
    fVar89 = fVar89 + fVar56;
    fVar101 = fVar101 + fVar58;
    fVar102 = fVar102 + fVar60;
    fVar103 = fVar103 + fVar74;
    fVar40 = *(float *)(ray + k * 4 + 0x30);
    fVar54 = *(float *)(ray + k * 4 + 0x80);
    uVar119 = -(uint)(fVar76 <= fVar54 && fVar40 <= fVar76);
    uVar120 = -(uint)(fVar78 <= fVar54 && fVar40 <= fVar78);
    uVar121 = -(uint)(fVar98 <= fVar54 && fVar40 <= fVar98);
    uVar122 = -(uint)(fVar99 <= fVar54 && fVar40 <= fVar99);
    uVar61 = uVar119 & auVar90._0_4_;
    uVar75 = uVar120 & auVar90._4_4_;
    auVar42._4_4_ = uVar75;
    auVar42._0_4_ = uVar61;
    uVar77 = uVar121 & auVar90._8_4_;
    uVar79 = uVar122 & auVar90._12_4_;
    uVar94 = -(uint)((fVar89 <= fVar54 && fVar40 <= fVar89) && bVar18);
    uVar95 = -(uint)((fVar101 <= fVar54 && fVar40 <= fVar101) && bVar19);
    uVar96 = -(uint)((fVar102 <= fVar54 && fVar40 <= fVar102) && bVar17);
    uVar97 = -(uint)((fVar103 <= fVar54 && fVar40 <= fVar103) && bVar16);
    auVar42._8_4_ = uVar77;
    auVar42._12_4_ = uVar79;
    auVar12._4_4_ = uVar95;
    auVar12._0_4_ = uVar94;
    auVar12._8_4_ = uVar96;
    auVar12._12_4_ = uVar97;
    local_238 = auVar42 | auVar12;
    iVar20 = movmskps(iVar20,local_238);
    if (iVar20 != 0) {
      fVar40 = (float)((uint)fVar76 & uVar61 | ~uVar61 & (uint)fVar89);
      fVar54 = (float)((uint)fVar78 & uVar75 | ~uVar75 & (uint)fVar101);
      fVar76 = (float)((uint)fVar98 & uVar77 | ~uVar77 & (uint)fVar102);
      fVar78 = (float)((uint)fVar99 & uVar79 | ~uVar79 & (uint)fVar103);
      fVar56 = (float)(~uVar61 & (uint)fVar56 | (uint)-fVar56 & uVar61);
      fVar58 = (float)(~uVar75 & (uint)fVar58 | (uint)-fVar58 & uVar75);
      fVar60 = (float)(~uVar77 & (uint)fVar60 | (uint)-fVar60 & uVar77);
      fVar74 = (float)(~uVar79 & (uint)fVar74 | (uint)-fVar74 & uVar79);
      local_1a8[0] = fVar40;
      local_1a8[1] = fVar54;
      local_1a8[2] = fVar76;
      local_1a8[3] = fVar78;
      local_198[0] = fVar39 * fVar56 - fVar108;
      local_198[1] = fVar39 * fVar58 - fVar109;
      local_198[2] = fVar39 * fVar60 - fVar110;
      local_198[3] = fVar39 * fVar74 - fVar38;
      local_188[0] = fVar100 * fVar56 - fVar104;
      local_188[1] = fVar100 * fVar58 - fVar105;
      local_188[2] = fVar100 * fVar60 - fVar106;
      local_188[3] = fVar100 * fVar74 - fVar107;
      local_178[0] = fVar56 * fVar118 - fVar111;
      local_178[1] = fVar58 * fVar118 - fVar112;
      local_178[2] = fVar60 * fVar118 - fVar113;
      local_178[3] = fVar74 * fVar118 - fVar114;
      uVar41 = local_238._0_4_;
      auVar63._0_4_ = (uint)fVar40 & uVar41;
      uVar55 = local_238._4_4_;
      auVar63._4_4_ = (uint)fVar54 & uVar55;
      uVar57 = local_238._8_4_;
      auVar63._8_4_ = (uint)fVar76 & uVar57;
      uVar59 = local_238._12_4_;
      auVar63._12_4_ = (uint)fVar78 & uVar59;
      auVar80._0_8_ = CONCAT44(~uVar55,~uVar41) & 0x7f8000007f800000;
      auVar80._8_4_ = ~uVar57 & 0x7f800000;
      auVar80._12_4_ = ~uVar59 & 0x7f800000;
      auVar80 = auVar80 | auVar63;
      auVar86._4_4_ = auVar80._0_4_;
      auVar86._0_4_ = auVar80._4_4_;
      auVar86._8_4_ = auVar80._12_4_;
      auVar86._12_4_ = auVar80._8_4_;
      auVar90 = minps(auVar86,auVar80);
      auVar64._0_8_ = auVar90._8_8_;
      auVar64._8_4_ = auVar90._0_4_;
      auVar64._12_4_ = auVar90._4_4_;
      auVar90 = minps(auVar64,auVar90);
      uVar34 = -(uint)(auVar90._0_4_ == auVar80._0_4_);
      uVar35 = -(uint)(auVar90._4_4_ == auVar80._4_4_);
      uVar36 = -(uint)(auVar90._8_4_ == auVar80._8_4_);
      uVar37 = -(uint)(auVar90._12_4_ == auVar80._12_4_);
      auVar81._0_4_ = uVar34 & uVar41;
      auVar81._4_4_ = uVar35 & uVar55;
      auVar81._8_4_ = uVar36 & uVar57;
      auVar81._12_4_ = uVar37 & uVar59;
      iVar20 = movmskps(iVar20,auVar81);
      uVar61 = 0xffffffff;
      uVar75 = 0xffffffff;
      uVar77 = 0xffffffff;
      uVar79 = 0xffffffff;
      if (iVar20 != 0) {
        uVar61 = uVar34;
        uVar75 = uVar35;
        uVar77 = uVar36;
        uVar79 = uVar37;
      }
      auVar43._0_4_ = uVar41 & uVar61;
      auVar43._4_4_ = uVar55 & uVar75;
      auVar43._8_4_ = uVar57 & uVar77;
      auVar43._12_4_ = uVar59 & uVar79;
      uVar61 = movmskps(iVar20,auVar43);
      lVar29 = 0;
      if (uVar61 != 0) {
        for (; (uVar61 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
        }
      }
      lVar33 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
      pSVar28 = local_228;
      pRVar31 = local_220;
      fVar115 = fVar39;
      fVar116 = fVar39;
      fVar117 = fVar39;
      fVar74 = fVar100;
      fVar98 = fVar100;
      fVar99 = fVar100;
      fVar56 = fVar118;
      fVar58 = fVar118;
      fVar60 = fVar118;
      do {
        local_1d8.hit = (RTCHitN *)&local_c8;
        local_1d8.valid = (int *)&local_208;
        local_68 = local_d8[lVar29];
        uVar23 = (ulong)local_68;
        pGVar10 = (pSVar28->geometries).items[uVar23].ptr;
        local_1d8.ray = (RTCRayN *)ray;
        if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          *(undefined4 *)(local_238 + lVar29 * 4) = 0;
        }
        else {
          if ((pRVar31->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            *(float *)(ray + k * 4 + 0x80) = local_1a8[lVar29];
            *(float *)(ray + k * 4 + 0xc0) = local_198[lVar29];
            *(float *)(ray + k * 4 + 0xd0) = local_188[lVar29];
            *(float *)(ray + k * 4 + 0xe0) = local_178[lVar29];
            *(undefined4 *)(ray + k * 4 + 0xf0) = 0;
            *(undefined4 *)(ray + k * 4 + 0x100) = 0;
            *(uint *)(ray + k * 4 + 0x110) = (sphere->primIDs).field_0.i[lVar29];
            *(uint *)(ray + k * 4 + 0x120) = local_68;
            *(uint *)(ray + k * 4 + 0x130) = pRVar31->user->instID[0];
            uVar61 = pRVar31->user->instPrimID[0];
            uVar22 = 0;
            *(uint *)(ray + k * 4 + 0x140) = uVar61;
LAB_00ba21fa:
            fVar40 = *(float *)(ray + k * 4 + 0x80);
            local_238._0_4_ = uVar119 & -(uint)(fVar89 <= fVar40) & uVar94;
            local_238._4_4_ = uVar120 & -(uint)(fVar101 <= fVar40) & uVar95;
            local_238._8_4_ = uVar121 & -(uint)(fVar102 <= fVar40) & uVar96;
            local_238._12_4_ = uVar122 & -(uint)(fVar103 <= fVar40) & uVar97;
            auVar14._4_4_ = local_238._4_4_;
            auVar14._0_4_ = local_238._0_4_;
            auVar14._8_4_ = local_238._8_4_;
            auVar14._12_4_ = local_238._12_4_;
            iVar20 = movmskps(uVar61,auVar14);
            if (iVar20 == 0) {
              return;
            }
            fVar40 = auVar92._0_4_;
            fVar54 = auVar92._4_4_;
            fVar76 = auVar92._8_4_;
            fVar78 = auVar92._12_4_;
            local_1a8[0] = fVar89;
            local_1a8[1] = fVar101;
            local_1a8[2] = fVar102;
            local_1a8[3] = fVar103;
            local_198[0] = fVar39 * fVar40 - fVar108;
            local_198[1] = fVar115 * fVar54 - fVar109;
            local_198[2] = fVar116 * fVar76 - fVar110;
            local_198[3] = fVar117 * fVar78 - fVar38;
            local_188[0] = fVar100 * fVar40 - fVar104;
            local_188[1] = fVar74 * fVar54 - fVar105;
            local_188[2] = fVar98 * fVar76 - fVar106;
            local_188[3] = fVar99 * fVar78 - fVar107;
            local_178[0] = fVar118 * fVar40 - fVar111;
            local_178[1] = fVar56 * fVar54 - fVar112;
            local_178[2] = fVar58 * fVar76 - fVar113;
            local_178[3] = fVar60 * fVar78 - fVar114;
            pSVar28 = pRVar31->scene;
            auVar47._0_4_ = (uint)fVar89 & local_238._0_4_;
            auVar47._4_4_ = (uint)fVar101 & local_238._4_4_;
            auVar47._8_4_ = (uint)fVar102 & local_238._8_4_;
            auVar47._12_4_ = (uint)fVar103 & local_238._12_4_;
            auVar69._0_8_ = CONCAT44(~local_238._4_4_,~local_238._0_4_) & 0x7f8000007f800000;
            auVar69._8_4_ = ~local_238._8_4_ & 0x7f800000;
            auVar69._12_4_ = ~local_238._12_4_ & 0x7f800000;
            auVar69 = auVar69 | auVar47;
            auVar83._4_4_ = auVar69._0_4_;
            auVar83._0_4_ = auVar69._4_4_;
            auVar83._8_4_ = auVar69._12_4_;
            auVar83._12_4_ = auVar69._8_4_;
            auVar92 = minps(auVar83,auVar69);
            auVar48._0_8_ = auVar92._8_8_;
            auVar48._8_4_ = auVar92._0_4_;
            auVar48._12_4_ = auVar92._4_4_;
            auVar92 = minps(auVar48,auVar92);
            auVar49._0_4_ = -(uint)(auVar92._0_4_ == auVar69._0_4_) & local_238._0_4_;
            auVar49._4_4_ = -(uint)(auVar92._4_4_ == auVar69._4_4_) & local_238._4_4_;
            auVar49._8_4_ = -(uint)(auVar92._8_4_ == auVar69._8_4_) & local_238._8_4_;
            auVar49._12_4_ = -(uint)(auVar92._12_4_ == auVar69._12_4_) & local_238._12_4_;
            iVar20 = movmskps(iVar20,auVar49);
            uVar96 = local_238._0_4_;
            uVar97 = local_238._4_4_;
            uVar119 = local_238._8_4_;
            uVar120 = local_238._12_4_;
            if (iVar20 != 0) {
              uVar96 = auVar49._0_4_;
              uVar97 = auVar49._4_4_;
              uVar119 = auVar49._8_4_;
              uVar120 = auVar49._12_4_;
            }
            auVar15._4_4_ = uVar97;
            auVar15._0_4_ = uVar96;
            auVar15._8_4_ = uVar119;
            auVar15._12_4_ = uVar120;
            uVar21 = movmskps(iVar20,auVar15);
            lVar33 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
            lVar29 = 0;
            if (CONCAT44(uVar22,uVar21) != 0) {
              for (; (CONCAT44(uVar22,uVar21) >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
              }
            }
            do {
              local_1d8.hit = (RTCHitN *)&local_c8;
              local_1d8.valid = (int *)&local_208;
              local_68 = local_d8[lVar29];
              uVar23 = (ulong)local_68;
              pGVar10 = (pSVar28->geometries).items[uVar23].ptr;
              if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_238 + lVar29 * 4) = 0;
              }
              else {
                if ((pRVar31->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x80) = local_1a8[lVar29];
                  *(float *)(ray + k * 4 + 0xc0) = local_198[lVar29];
                  *(float *)(ray + k * 4 + 0xd0) = local_188[lVar29];
                  *(float *)(ray + k * 4 + 0xe0) = local_178[lVar29];
                  *(undefined4 *)(ray + k * 4 + 0xf0) = 0;
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                  *(uint *)(ray + k * 4 + 0x110) = (sphere->primIDs).field_0.i[lVar29];
                  *(uint *)(ray + k * 4 + 0x120) = local_68;
                  *(uint *)(ray + k * 4 + 0x130) = pRVar31->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = pRVar31->user->instPrimID[0];
                  return;
                }
                local_78 = (sphere->primIDs).field_0.i[lVar29];
                local_c8 = local_198[lVar29];
                local_b8 = local_188[lVar29];
                fVar38 = local_178[lVar29];
                local_a8._4_4_ = fVar38;
                local_a8._0_4_ = fVar38;
                fStack_a0 = fVar38;
                fStack_9c = fVar38;
                fStack_c4 = local_c8;
                fStack_c0 = local_c8;
                fStack_bc = local_c8;
                fStack_b4 = local_b8;
                fStack_b0 = local_b8;
                fStack_ac = local_b8;
                local_88 = 0;
                uStack_80 = 0;
                local_98 = 0;
                uStack_90 = 0;
                uStack_74 = local_78;
                uStack_70 = local_78;
                uStack_6c = local_78;
                uStack_64 = local_68;
                uStack_60 = local_68;
                uStack_5c = local_68;
                local_58 = pRVar31->user->instID[0];
                uStack_54 = local_58;
                uStack_50 = local_58;
                uStack_4c = local_58;
                local_48 = pRVar31->user->instPrimID[0];
                uStack_44 = local_48;
                uStack_40 = local_48;
                uStack_3c = local_48;
                local_228 = (Scene *)CONCAT44(local_228._4_4_,*(undefined4 *)(ray + k * 4 + 0x80));
                *(float *)(ray + k * 4 + 0x80) = local_1a8[lVar29];
                local_208 = *(undefined8 *)(mm_lookupmask_ps + lVar33);
                uStack_200 = *(undefined8 *)(mm_lookupmask_ps + lVar33 + 8);
                local_1d8.geometryUserPtr = pGVar10->userPtr;
                local_1d8.context = pRVar31->user;
                local_1d8.N = 4;
                p_Var24 = pGVar10->intersectionFilterN;
                local_1f8._4_4_ = fVar101;
                local_1f8._0_4_ = fVar89;
                fStack_1f0 = fVar102;
                fStack_1ec = fVar103;
                local_218 = pSVar28;
                local_1d8.ray = (RTCRayN *)ray;
                if (p_Var24 != (RTCFilterFunctionN)0x0) {
                  p_Var24 = (RTCFilterFunctionN)(*p_Var24)(&local_1d8);
                  pRVar31 = local_220;
                  fVar89 = (float)local_1f8._0_4_;
                  fVar101 = (float)local_1f8._4_4_;
                  fVar102 = fStack_1f0;
                  fVar103 = fStack_1ec;
                }
                auVar50._0_4_ = -(uint)((int)local_208 == 0);
                auVar50._4_4_ = -(uint)(local_208._4_4_ == 0);
                auVar50._8_4_ = -(uint)((int)uStack_200 == 0);
                auVar50._12_4_ = -(uint)(uStack_200._4_4_ == 0);
                uVar96 = movmskps((int)p_Var24,auVar50);
                pRVar25 = (RayHitK<4> *)(ulong)(uVar96 ^ 0xf);
                if ((uVar96 ^ 0xf) == 0) {
                  auVar13._8_4_ = 0xffffffff;
                  auVar13._0_8_ = 0xffffffffffffffff;
                  auVar13._12_4_ = 0xffffffff;
                  auVar51 = auVar50 ^ auVar13;
                  pSVar28 = local_218;
                }
                else {
                  p_Var24 = pRVar31->args->filter;
                  if ((p_Var24 != (RTCFilterFunctionN)0x0) &&
                     (((pRVar31->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    p_Var24 = (RTCFilterFunctionN)(*p_Var24)(&local_1d8);
                    pRVar31 = local_220;
                    fVar89 = (float)local_1f8._0_4_;
                    fVar101 = (float)local_1f8._4_4_;
                    fVar102 = fStack_1f0;
                    fVar103 = fStack_1ec;
                  }
                  auVar70._0_4_ = -(uint)((int)local_208 == 0);
                  auVar70._4_4_ = -(uint)(local_208._4_4_ == 0);
                  auVar70._8_4_ = -(uint)((int)uStack_200 == 0);
                  auVar70._12_4_ = -(uint)(uStack_200._4_4_ == 0);
                  auVar51._8_4_ = 0xffffffff;
                  auVar51._0_8_ = 0xffffffffffffffff;
                  auVar51._12_4_ = 0xffffffff;
                  auVar51 = auVar70 ^ auVar51;
                  uVar96 = movmskps((int)p_Var24,auVar70);
                  pRVar25 = (RayHitK<4> *)(ulong)(uVar96 ^ 0xf);
                  pSVar28 = local_218;
                  if ((uVar96 ^ 0xf) != 0) {
                    fVar38 = *(float *)(local_1d8.hit + 4);
                    fVar107 = *(float *)(local_1d8.hit + 8);
                    fVar114 = *(float *)(local_1d8.hit + 0xc);
                    *(uint *)(local_1d8.ray + 0xc0) =
                         ~auVar70._0_4_ & (uint)*(float *)local_1d8.hit |
                         *(uint *)(local_1d8.ray + 0xc0) & auVar70._0_4_;
                    *(uint *)(local_1d8.ray + 0xc4) =
                         ~auVar70._4_4_ & (uint)fVar38 |
                         *(uint *)(local_1d8.ray + 0xc4) & auVar70._4_4_;
                    *(uint *)(local_1d8.ray + 200) =
                         ~auVar70._8_4_ & (uint)fVar107 |
                         *(uint *)(local_1d8.ray + 200) & auVar70._8_4_;
                    *(uint *)(local_1d8.ray + 0xcc) =
                         ~auVar70._12_4_ & (uint)fVar114 |
                         *(uint *)(local_1d8.ray + 0xcc) & auVar70._12_4_;
                    fVar38 = *(float *)(local_1d8.hit + 0x14);
                    fVar107 = *(float *)(local_1d8.hit + 0x18);
                    fVar114 = *(float *)(local_1d8.hit + 0x1c);
                    *(uint *)(local_1d8.ray + 0xd0) =
                         ~auVar70._0_4_ & (uint)*(float *)(local_1d8.hit + 0x10) |
                         *(uint *)(local_1d8.ray + 0xd0) & auVar70._0_4_;
                    *(uint *)(local_1d8.ray + 0xd4) =
                         ~auVar70._4_4_ & (uint)fVar38 |
                         *(uint *)(local_1d8.ray + 0xd4) & auVar70._4_4_;
                    *(uint *)(local_1d8.ray + 0xd8) =
                         ~auVar70._8_4_ & (uint)fVar107 |
                         *(uint *)(local_1d8.ray + 0xd8) & auVar70._8_4_;
                    *(uint *)(local_1d8.ray + 0xdc) =
                         ~auVar70._12_4_ & (uint)fVar114 |
                         *(uint *)(local_1d8.ray + 0xdc) & auVar70._12_4_;
                    auVar93._0_4_ = *(uint *)(local_1d8.ray + 0xe0) & auVar70._0_4_;
                    auVar93._4_4_ = *(uint *)(local_1d8.ray + 0xe4) & auVar70._4_4_;
                    auVar93._8_4_ = *(uint *)(local_1d8.ray + 0xe8) & auVar70._8_4_;
                    auVar93._12_4_ = *(uint *)(local_1d8.ray + 0xec) & auVar70._12_4_;
                    auVar84._0_4_ = ~auVar70._0_4_ & (uint)*(float *)(local_1d8.hit + 0x20);
                    auVar84._4_4_ = ~auVar70._4_4_ & (uint)*(float *)(local_1d8.hit + 0x24);
                    auVar84._8_4_ = ~auVar70._8_4_ & (uint)*(float *)(local_1d8.hit + 0x28);
                    auVar84._12_4_ = ~auVar70._12_4_ & (uint)*(float *)(local_1d8.hit + 0x2c);
                    *(undefined1 (*) [16])(local_1d8.ray + 0xe0) = auVar84 | auVar93;
                    fVar38 = *(float *)(local_1d8.hit + 0x34);
                    fVar107 = *(float *)(local_1d8.hit + 0x38);
                    fVar114 = *(float *)(local_1d8.hit + 0x3c);
                    *(uint *)(local_1d8.ray + 0xf0) =
                         ~auVar70._0_4_ & (uint)*(float *)(local_1d8.hit + 0x30) |
                         *(uint *)(local_1d8.ray + 0xf0) & auVar70._0_4_;
                    *(uint *)(local_1d8.ray + 0xf4) =
                         ~auVar70._4_4_ & (uint)fVar38 |
                         *(uint *)(local_1d8.ray + 0xf4) & auVar70._4_4_;
                    *(uint *)(local_1d8.ray + 0xf8) =
                         ~auVar70._8_4_ & (uint)fVar107 |
                         *(uint *)(local_1d8.ray + 0xf8) & auVar70._8_4_;
                    *(uint *)(local_1d8.ray + 0xfc) =
                         ~auVar70._12_4_ & (uint)fVar114 |
                         *(uint *)(local_1d8.ray + 0xfc) & auVar70._12_4_;
                    fVar38 = *(float *)(local_1d8.hit + 0x44);
                    fVar107 = *(float *)(local_1d8.hit + 0x48);
                    fVar114 = *(float *)(local_1d8.hit + 0x4c);
                    *(uint *)(local_1d8.ray + 0x100) =
                         ~auVar70._0_4_ & (uint)*(float *)(local_1d8.hit + 0x40) |
                         *(uint *)(local_1d8.ray + 0x100) & auVar70._0_4_;
                    *(uint *)(local_1d8.ray + 0x104) =
                         ~auVar70._4_4_ & (uint)fVar38 |
                         *(uint *)(local_1d8.ray + 0x104) & auVar70._4_4_;
                    *(uint *)(local_1d8.ray + 0x108) =
                         ~auVar70._8_4_ & (uint)fVar107 |
                         *(uint *)(local_1d8.ray + 0x108) & auVar70._8_4_;
                    *(uint *)(local_1d8.ray + 0x10c) =
                         ~auVar70._12_4_ & (uint)fVar114 |
                         *(uint *)(local_1d8.ray + 0x10c) & auVar70._12_4_;
                    fVar38 = *(float *)(local_1d8.hit + 0x54);
                    fVar107 = *(float *)(local_1d8.hit + 0x58);
                    fVar114 = *(float *)(local_1d8.hit + 0x5c);
                    *(uint *)(local_1d8.ray + 0x110) =
                         *(uint *)(local_1d8.ray + 0x110) & auVar70._0_4_ |
                         ~auVar70._0_4_ & (uint)*(float *)(local_1d8.hit + 0x50);
                    *(uint *)(local_1d8.ray + 0x114) =
                         *(uint *)(local_1d8.ray + 0x114) & auVar70._4_4_ |
                         ~auVar70._4_4_ & (uint)fVar38;
                    *(uint *)(local_1d8.ray + 0x118) =
                         *(uint *)(local_1d8.ray + 0x118) & auVar70._8_4_ |
                         ~auVar70._8_4_ & (uint)fVar107;
                    *(uint *)(local_1d8.ray + 0x11c) =
                         *(uint *)(local_1d8.ray + 0x11c) & auVar70._12_4_ |
                         ~auVar70._12_4_ & (uint)fVar114;
                    fVar38 = *(float *)(local_1d8.hit + 100);
                    fVar107 = *(float *)(local_1d8.hit + 0x68);
                    fVar114 = *(float *)(local_1d8.hit + 0x6c);
                    *(uint *)(local_1d8.ray + 0x120) =
                         *(uint *)(local_1d8.ray + 0x120) & auVar70._0_4_ |
                         ~auVar70._0_4_ & (uint)*(float *)(local_1d8.hit + 0x60);
                    *(uint *)(local_1d8.ray + 0x124) =
                         *(uint *)(local_1d8.ray + 0x124) & auVar70._4_4_ |
                         ~auVar70._4_4_ & (uint)fVar38;
                    *(uint *)(local_1d8.ray + 0x128) =
                         *(uint *)(local_1d8.ray + 0x128) & auVar70._8_4_ |
                         ~auVar70._8_4_ & (uint)fVar107;
                    *(uint *)(local_1d8.ray + 300) =
                         *(uint *)(local_1d8.ray + 300) & auVar70._12_4_ |
                         ~auVar70._12_4_ & (uint)fVar114;
                    fVar38 = *(float *)(local_1d8.hit + 0x74);
                    fVar107 = *(float *)(local_1d8.hit + 0x78);
                    fVar114 = *(float *)(local_1d8.hit + 0x7c);
                    *(uint *)(local_1d8.ray + 0x130) =
                         ~auVar70._0_4_ & (uint)*(float *)(local_1d8.hit + 0x70) |
                         *(uint *)(local_1d8.ray + 0x130) & auVar70._0_4_;
                    *(uint *)(local_1d8.ray + 0x134) =
                         ~auVar70._4_4_ & (uint)fVar38 |
                         *(uint *)(local_1d8.ray + 0x134) & auVar70._4_4_;
                    *(uint *)(local_1d8.ray + 0x138) =
                         ~auVar70._8_4_ & (uint)fVar107 |
                         *(uint *)(local_1d8.ray + 0x138) & auVar70._8_4_;
                    *(uint *)(local_1d8.ray + 0x13c) =
                         ~auVar70._12_4_ & (uint)fVar114 |
                         *(uint *)(local_1d8.ray + 0x13c) & auVar70._12_4_;
                    *(undefined1 (*) [16])(local_1d8.ray + 0x140) =
                         ~auVar70 & *(undefined1 (*) [16])(local_1d8.hit + 0x80) |
                         *(undefined1 (*) [16])(local_1d8.ray + 0x140) & auVar70;
                    pRVar25 = (RayHitK<4> *)local_1d8.ray;
                  }
                }
                auVar53._0_4_ = auVar51._0_4_ << 0x1f;
                auVar53._4_4_ = auVar51._4_4_ << 0x1f;
                auVar53._8_4_ = auVar51._8_4_ << 0x1f;
                auVar53._12_4_ = auVar51._12_4_ << 0x1f;
                iVar20 = movmskps((int)pRVar25,auVar53);
                uVar23 = CONCAT44((int)((ulong)pRVar25 >> 0x20),iVar20);
                if (iVar20 == 0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_228._0_4_;
                }
                *(undefined4 *)(local_238 + lVar29 * 4) = 0;
                fVar38 = *(float *)(ray + k * 4 + 0x80);
                local_238._4_4_ = -(uint)(fVar101 <= fVar38) & local_238._4_4_;
                local_238._0_4_ = -(uint)(fVar89 <= fVar38) & local_238._0_4_;
                local_238._8_4_ = -(uint)(fVar102 <= fVar38) & local_238._8_4_;
                local_238._12_4_ = -(uint)(fVar103 <= fVar38) & local_238._12_4_;
              }
              uVar96 = local_238._0_4_;
              uVar97 = local_238._4_4_;
              uVar119 = local_238._8_4_;
              uVar120 = local_238._12_4_;
              iVar20 = movmskps((int)uVar23,local_238);
              if (iVar20 == 0) {
                return;
              }
              auVar71._0_4_ = uVar96 & (uint)fVar89;
              auVar71._4_4_ = uVar97 & (uint)fVar101;
              auVar71._8_4_ = uVar119 & (uint)fVar102;
              auVar71._12_4_ = uVar120 & (uint)fVar103;
              auVar85._0_8_ = CONCAT44(~uVar97,~uVar96) & 0x7f8000007f800000;
              auVar85._8_4_ = ~uVar119 & 0x7f800000;
              auVar85._12_4_ = ~uVar120 & 0x7f800000;
              auVar85 = auVar85 | auVar71;
              auVar88._4_4_ = auVar85._0_4_;
              auVar88._0_4_ = auVar85._4_4_;
              auVar88._8_4_ = auVar85._12_4_;
              auVar88._12_4_ = auVar85._8_4_;
              auVar92 = minps(auVar88,auVar85);
              auVar72._0_8_ = auVar92._8_8_;
              auVar72._8_4_ = auVar92._0_4_;
              auVar72._12_4_ = auVar92._4_4_;
              auVar92 = minps(auVar72,auVar92);
              auVar73._0_8_ =
                   CONCAT44(-(uint)(auVar92._4_4_ == auVar85._4_4_) & uVar97,
                            -(uint)(auVar92._0_4_ == auVar85._0_4_) & uVar96);
              auVar73._8_4_ = -(uint)(auVar92._8_4_ == auVar85._8_4_) & uVar119;
              auVar73._12_4_ = -(uint)(auVar92._12_4_ == auVar85._12_4_) & uVar120;
              iVar20 = movmskps(iVar20,auVar73);
              auVar52 = local_238;
              if (iVar20 != 0) {
                auVar52._8_4_ = auVar73._8_4_;
                auVar52._0_8_ = auVar73._0_8_;
                auVar52._12_4_ = auVar73._12_4_;
              }
              uVar22 = movmskps(iVar20,auVar52);
              uVar23 = CONCAT44((int)(uVar23 >> 0x20),uVar22);
              lVar29 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                }
              }
            } while( true );
          }
          local_168 = auVar92;
          local_78 = (sphere->primIDs).field_0.i[lVar29];
          local_c8 = local_198[lVar29];
          local_b8 = local_188[lVar29];
          local_a8._4_4_ = local_178[lVar29];
          fStack_c4 = local_c8;
          fStack_c0 = local_c8;
          fStack_bc = local_c8;
          fStack_b4 = local_b8;
          fStack_b0 = local_b8;
          fStack_ac = local_b8;
          local_a8._0_4_ = local_a8._4_4_;
          fStack_a0 = (float)local_a8._4_4_;
          fStack_9c = (float)local_a8._4_4_;
          local_88 = 0;
          uStack_80 = 0;
          local_98 = 0;
          uStack_90 = 0;
          uStack_74 = local_78;
          uStack_70 = local_78;
          uStack_6c = local_78;
          uStack_64 = local_68;
          uStack_60 = local_68;
          uStack_5c = local_68;
          local_58 = pRVar31->user->instID[0];
          uStack_54 = local_58;
          uStack_50 = local_58;
          uStack_4c = local_58;
          local_48 = pRVar31->user->instPrimID[0];
          uStack_44 = local_48;
          uStack_40 = local_48;
          uStack_3c = local_48;
          local_1dc = *(undefined4 *)(ray + k * 4 + 0x80);
          *(float *)(ray + k * 4 + 0x80) = local_1a8[lVar29];
          local_208 = *(undefined8 *)(mm_lookupmask_ps + lVar33);
          uStack_200 = *(undefined8 *)(mm_lookupmask_ps + lVar33 + 8);
          local_1d8.geometryUserPtr = pGVar10->userPtr;
          local_1d8.context = pRVar31->user;
          local_1d8.N = 4;
          p_Var24 = pGVar10->intersectionFilterN;
          local_1f8._4_4_ = fVar101;
          local_1f8._0_4_ = fVar89;
          fStack_1f0 = fVar102;
          fStack_1ec = fVar103;
          local_e8 = fVar104;
          fStack_e4 = fVar105;
          fStack_e0 = fVar106;
          fStack_dc = fVar107;
          local_f8 = fVar108;
          fStack_f4 = fVar109;
          fStack_f0 = fVar110;
          fStack_ec = fVar38;
          local_108 = fVar111;
          fStack_104 = fVar112;
          fStack_100 = fVar113;
          fStack_fc = fVar114;
          local_118 = fVar39;
          fStack_114 = fVar115;
          fStack_110 = fVar116;
          fStack_10c = fVar117;
          local_128 = fVar100;
          fStack_124 = fVar74;
          fStack_120 = fVar98;
          fStack_11c = fVar99;
          local_138 = fVar118;
          fStack_134 = fVar56;
          fStack_130 = fVar58;
          fStack_12c = fVar60;
          local_148 = uVar119;
          uStack_144 = uVar120;
          uStack_140 = uVar121;
          uStack_13c = uVar122;
          local_158 = fVar40;
          fStack_154 = fVar54;
          fStack_150 = fVar76;
          fStack_14c = fVar78;
          uStack_210 = uVar96;
          uStack_20c = uVar97;
          local_218._0_4_ = (float)uVar94;
          local_218._4_4_ = uVar95;
          if (p_Var24 != (RTCFilterFunctionN)0x0) {
            p_Var24 = (RTCFilterFunctionN)(*p_Var24)(&local_1d8);
            pSVar28 = local_228;
            pRVar31 = local_220;
            fVar89 = (float)local_1f8._0_4_;
            fVar101 = (float)local_1f8._4_4_;
            fVar102 = fStack_1f0;
            fVar103 = fStack_1ec;
          }
          auVar44._0_4_ = -(uint)((int)local_208 == 0);
          auVar44._4_4_ = -(uint)(local_208._4_4_ == 0);
          auVar44._8_4_ = -(uint)((int)uStack_200 == 0);
          auVar44._12_4_ = -(uint)(uStack_200._4_4_ == 0);
          uVar96 = movmskps((int)p_Var24,auVar44);
          pRVar25 = (RayHitK<4> *)(ulong)(uVar96 ^ 0xf);
          if ((uVar96 ^ 0xf) == 0) {
            auVar44 = auVar44 ^ _DAT_01febe20;
            uVar94 = (uint)(float)local_218;
            uVar95 = local_218._4_4_;
          }
          else {
            p_Var24 = pRVar31->args->filter;
            if ((p_Var24 != (RTCFilterFunctionN)0x0) &&
               (((pRVar31->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
              p_Var24 = (RTCFilterFunctionN)(*p_Var24)(&local_1d8);
              pSVar28 = local_228;
              pRVar31 = local_220;
              fVar89 = (float)local_1f8._0_4_;
              fVar101 = (float)local_1f8._4_4_;
              fVar102 = fStack_1f0;
              fVar103 = fStack_1ec;
            }
            auVar65._0_4_ = -(uint)((int)local_208 == 0);
            auVar65._4_4_ = -(uint)(local_208._4_4_ == 0);
            auVar65._8_4_ = -(uint)((int)uStack_200 == 0);
            auVar65._12_4_ = -(uint)(uStack_200._4_4_ == 0);
            auVar44 = auVar65 ^ _DAT_01febe20;
            uVar96 = movmskps((int)p_Var24,auVar65);
            pRVar25 = (RayHitK<4> *)(ulong)(uVar96 ^ 0xf);
            uVar94 = (uint)(float)local_218;
            uVar95 = local_218._4_4_;
            if ((uVar96 ^ 0xf) != 0) {
              fVar38 = *(float *)(local_1d8.hit + 4);
              fVar107 = *(float *)(local_1d8.hit + 8);
              fVar114 = *(float *)(local_1d8.hit + 0xc);
              *(uint *)(local_1d8.ray + 0xc0) =
                   ~auVar65._0_4_ & (uint)*(float *)local_1d8.hit |
                   *(uint *)(local_1d8.ray + 0xc0) & auVar65._0_4_;
              *(uint *)(local_1d8.ray + 0xc4) =
                   ~auVar65._4_4_ & (uint)fVar38 | *(uint *)(local_1d8.ray + 0xc4) & auVar65._4_4_;
              *(uint *)(local_1d8.ray + 200) =
                   ~auVar65._8_4_ & (uint)fVar107 | *(uint *)(local_1d8.ray + 200) & auVar65._8_4_;
              *(uint *)(local_1d8.ray + 0xcc) =
                   ~auVar65._12_4_ & (uint)fVar114 |
                   *(uint *)(local_1d8.ray + 0xcc) & auVar65._12_4_;
              fVar38 = *(float *)(local_1d8.hit + 0x14);
              fVar107 = *(float *)(local_1d8.hit + 0x18);
              fVar114 = *(float *)(local_1d8.hit + 0x1c);
              *(uint *)(local_1d8.ray + 0xd0) =
                   ~auVar65._0_4_ & (uint)*(float *)(local_1d8.hit + 0x10) |
                   *(uint *)(local_1d8.ray + 0xd0) & auVar65._0_4_;
              *(uint *)(local_1d8.ray + 0xd4) =
                   ~auVar65._4_4_ & (uint)fVar38 | *(uint *)(local_1d8.ray + 0xd4) & auVar65._4_4_;
              *(uint *)(local_1d8.ray + 0xd8) =
                   ~auVar65._8_4_ & (uint)fVar107 | *(uint *)(local_1d8.ray + 0xd8) & auVar65._8_4_;
              *(uint *)(local_1d8.ray + 0xdc) =
                   ~auVar65._12_4_ & (uint)fVar114 |
                   *(uint *)(local_1d8.ray + 0xdc) & auVar65._12_4_;
              fVar38 = *(float *)(local_1d8.hit + 0x24);
              fVar107 = *(float *)(local_1d8.hit + 0x28);
              fVar114 = *(float *)(local_1d8.hit + 0x2c);
              *(uint *)(local_1d8.ray + 0xe0) =
                   ~auVar65._0_4_ & (uint)*(float *)(local_1d8.hit + 0x20) |
                   *(uint *)(local_1d8.ray + 0xe0) & auVar65._0_4_;
              *(uint *)(local_1d8.ray + 0xe4) =
                   ~auVar65._4_4_ & (uint)fVar38 | *(uint *)(local_1d8.ray + 0xe4) & auVar65._4_4_;
              *(uint *)(local_1d8.ray + 0xe8) =
                   ~auVar65._8_4_ & (uint)fVar107 | *(uint *)(local_1d8.ray + 0xe8) & auVar65._8_4_;
              *(uint *)(local_1d8.ray + 0xec) =
                   ~auVar65._12_4_ & (uint)fVar114 |
                   *(uint *)(local_1d8.ray + 0xec) & auVar65._12_4_;
              fVar38 = *(float *)(local_1d8.hit + 0x34);
              fVar107 = *(float *)(local_1d8.hit + 0x38);
              fVar114 = *(float *)(local_1d8.hit + 0x3c);
              *(uint *)(local_1d8.ray + 0xf0) =
                   ~auVar65._0_4_ & (uint)*(float *)(local_1d8.hit + 0x30) |
                   *(uint *)(local_1d8.ray + 0xf0) & auVar65._0_4_;
              *(uint *)(local_1d8.ray + 0xf4) =
                   ~auVar65._4_4_ & (uint)fVar38 | *(uint *)(local_1d8.ray + 0xf4) & auVar65._4_4_;
              *(uint *)(local_1d8.ray + 0xf8) =
                   ~auVar65._8_4_ & (uint)fVar107 | *(uint *)(local_1d8.ray + 0xf8) & auVar65._8_4_;
              *(uint *)(local_1d8.ray + 0xfc) =
                   ~auVar65._12_4_ & (uint)fVar114 |
                   *(uint *)(local_1d8.ray + 0xfc) & auVar65._12_4_;
              fVar38 = *(float *)(local_1d8.hit + 0x44);
              fVar107 = *(float *)(local_1d8.hit + 0x48);
              fVar114 = *(float *)(local_1d8.hit + 0x4c);
              *(uint *)(local_1d8.ray + 0x100) =
                   ~auVar65._0_4_ & (uint)*(float *)(local_1d8.hit + 0x40) |
                   *(uint *)(local_1d8.ray + 0x100) & auVar65._0_4_;
              *(uint *)(local_1d8.ray + 0x104) =
                   ~auVar65._4_4_ & (uint)fVar38 | *(uint *)(local_1d8.ray + 0x104) & auVar65._4_4_;
              *(uint *)(local_1d8.ray + 0x108) =
                   ~auVar65._8_4_ & (uint)fVar107 | *(uint *)(local_1d8.ray + 0x108) & auVar65._8_4_
              ;
              *(uint *)(local_1d8.ray + 0x10c) =
                   ~auVar65._12_4_ & (uint)fVar114 |
                   *(uint *)(local_1d8.ray + 0x10c) & auVar65._12_4_;
              fVar38 = *(float *)(local_1d8.hit + 0x54);
              fVar107 = *(float *)(local_1d8.hit + 0x58);
              fVar114 = *(float *)(local_1d8.hit + 0x5c);
              *(uint *)(local_1d8.ray + 0x110) =
                   *(uint *)(local_1d8.ray + 0x110) & auVar65._0_4_ |
                   ~auVar65._0_4_ & (uint)*(float *)(local_1d8.hit + 0x50);
              *(uint *)(local_1d8.ray + 0x114) =
                   *(uint *)(local_1d8.ray + 0x114) & auVar65._4_4_ | ~auVar65._4_4_ & (uint)fVar38;
              *(uint *)(local_1d8.ray + 0x118) =
                   *(uint *)(local_1d8.ray + 0x118) & auVar65._8_4_ | ~auVar65._8_4_ & (uint)fVar107
              ;
              *(uint *)(local_1d8.ray + 0x11c) =
                   *(uint *)(local_1d8.ray + 0x11c) & auVar65._12_4_ |
                   ~auVar65._12_4_ & (uint)fVar114;
              fVar38 = *(float *)(local_1d8.hit + 100);
              fVar107 = *(float *)(local_1d8.hit + 0x68);
              fVar114 = *(float *)(local_1d8.hit + 0x6c);
              *(uint *)(local_1d8.ray + 0x120) =
                   *(uint *)(local_1d8.ray + 0x120) & auVar65._0_4_ |
                   ~auVar65._0_4_ & (uint)*(float *)(local_1d8.hit + 0x60);
              *(uint *)(local_1d8.ray + 0x124) =
                   *(uint *)(local_1d8.ray + 0x124) & auVar65._4_4_ | ~auVar65._4_4_ & (uint)fVar38;
              *(uint *)(local_1d8.ray + 0x128) =
                   *(uint *)(local_1d8.ray + 0x128) & auVar65._8_4_ | ~auVar65._8_4_ & (uint)fVar107
              ;
              *(uint *)(local_1d8.ray + 300) =
                   *(uint *)(local_1d8.ray + 300) & auVar65._12_4_ | ~auVar65._12_4_ & (uint)fVar114
              ;
              fVar38 = *(float *)(local_1d8.hit + 0x74);
              fVar107 = *(float *)(local_1d8.hit + 0x78);
              fVar114 = *(float *)(local_1d8.hit + 0x7c);
              *(uint *)(local_1d8.ray + 0x130) =
                   ~auVar65._0_4_ & (uint)*(float *)(local_1d8.hit + 0x70) |
                   *(uint *)(local_1d8.ray + 0x130) & auVar65._0_4_;
              *(uint *)(local_1d8.ray + 0x134) =
                   ~auVar65._4_4_ & (uint)fVar38 | *(uint *)(local_1d8.ray + 0x134) & auVar65._4_4_;
              *(uint *)(local_1d8.ray + 0x138) =
                   ~auVar65._8_4_ & (uint)fVar107 | *(uint *)(local_1d8.ray + 0x138) & auVar65._8_4_
              ;
              *(uint *)(local_1d8.ray + 0x13c) =
                   ~auVar65._12_4_ & (uint)fVar114 |
                   *(uint *)(local_1d8.ray + 0x13c) & auVar65._12_4_;
              *(undefined1 (*) [16])(local_1d8.ray + 0x140) =
                   ~auVar65 & *(undefined1 (*) [16])(local_1d8.hit + 0x80) |
                   *(undefined1 (*) [16])(local_1d8.ray + 0x140) & auVar65;
              pRVar25 = (RayHitK<4> *)local_1d8.ray;
            }
          }
          fVar107 = fStack_dc;
          fVar106 = fStack_e0;
          fVar105 = fStack_e4;
          fVar104 = local_e8;
          fVar38 = fStack_ec;
          fVar110 = fStack_f0;
          fVar109 = fStack_f4;
          fVar108 = local_f8;
          fVar114 = fStack_fc;
          fVar113 = fStack_100;
          fVar112 = fStack_104;
          fVar111 = local_108;
          fVar117 = fStack_10c;
          fVar116 = fStack_110;
          fVar115 = fStack_114;
          fVar39 = local_118;
          fVar99 = fStack_11c;
          fVar98 = fStack_120;
          fVar74 = fStack_124;
          fVar100 = local_128;
          fVar60 = fStack_12c;
          fVar58 = fStack_130;
          fVar56 = fStack_134;
          fVar118 = local_138;
          uVar122 = uStack_13c;
          uVar121 = uStack_140;
          uVar120 = uStack_144;
          uVar119 = local_148;
          fVar78 = fStack_14c;
          fVar76 = fStack_150;
          fVar54 = fStack_154;
          fVar40 = local_158;
          auVar92 = local_168;
          uVar97 = uStack_20c;
          uVar96 = uStack_210;
          auVar46._0_4_ = auVar44._0_4_ << 0x1f;
          auVar46._4_4_ = auVar44._4_4_ << 0x1f;
          auVar46._8_4_ = auVar44._8_4_ << 0x1f;
          auVar46._12_4_ = auVar44._12_4_ << 0x1f;
          iVar20 = movmskps((int)pRVar25,auVar46);
          uVar23 = CONCAT44((int)((ulong)pRVar25 >> 0x20),iVar20);
          if (iVar20 == 0) {
            *(undefined4 *)(ray + k * 4 + 0x80) = local_1dc;
          }
          *(undefined4 *)(local_238 + lVar29 * 4) = 0;
          fVar9 = *(float *)(ray + k * 4 + 0x80);
          local_238._4_4_ = -(uint)(fVar54 <= fVar9) & local_238._4_4_;
          local_238._0_4_ = -(uint)(fVar40 <= fVar9) & local_238._0_4_;
          local_238._8_4_ = -(uint)(fVar76 <= fVar9) & local_238._8_4_;
          local_238._12_4_ = -(uint)(fVar78 <= fVar9) & local_238._12_4_;
        }
        uVar75 = local_238._0_4_;
        uVar77 = local_238._4_4_;
        uVar79 = local_238._8_4_;
        uVar34 = local_238._12_4_;
        uVar22 = (undefined4)(uVar23 >> 0x20);
        uVar61 = movmskps((int)uVar23,local_238);
        if (uVar61 == 0) goto LAB_00ba21fa;
        auVar66._0_4_ = uVar75 & (uint)fVar40;
        auVar66._4_4_ = uVar77 & (uint)fVar54;
        auVar66._8_4_ = uVar79 & (uint)fVar76;
        auVar66._12_4_ = uVar34 & (uint)fVar78;
        auVar82._0_8_ = CONCAT44(~uVar77,~uVar75) & 0x7f8000007f800000;
        auVar82._8_4_ = ~uVar79 & 0x7f800000;
        auVar82._12_4_ = ~uVar34 & 0x7f800000;
        auVar82 = auVar82 | auVar66;
        auVar87._4_4_ = auVar82._0_4_;
        auVar87._0_4_ = auVar82._4_4_;
        auVar87._8_4_ = auVar82._12_4_;
        auVar87._12_4_ = auVar82._8_4_;
        auVar90 = minps(auVar87,auVar82);
        auVar67._0_8_ = auVar90._8_8_;
        auVar67._8_4_ = auVar90._0_4_;
        auVar67._12_4_ = auVar90._4_4_;
        auVar90 = minps(auVar67,auVar90);
        auVar68._0_8_ =
             CONCAT44(-(uint)(auVar90._4_4_ == auVar82._4_4_) & uVar77,
                      -(uint)(auVar90._0_4_ == auVar82._0_4_) & uVar75);
        auVar68._8_4_ = -(uint)(auVar90._8_4_ == auVar82._8_4_) & uVar79;
        auVar68._12_4_ = -(uint)(auVar90._12_4_ == auVar82._12_4_) & uVar34;
        iVar20 = movmskps(uVar61,auVar68);
        auVar45 = local_238;
        if (iVar20 != 0) {
          auVar45._8_4_ = auVar68._8_4_;
          auVar45._0_8_ = auVar68._0_8_;
          auVar45._12_4_ = auVar68._12_4_;
        }
        uVar21 = movmskps(iVar20,auVar45);
        lVar29 = 0;
        if (CONCAT44(uVar22,uVar21) != 0) {
          for (; (CONCAT44(uVar22,uVar21) >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom, ray.time()[k]);
        const vbool<M> valid = sphere.valid();
        SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Intersect1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }